

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_generator.cc
# Opt level: O1

void __thiscall re2::StringGenerator::~StringGenerator(StringGenerator *this)

{
  pointer piVar1;
  pointer pcVar2;
  
  if (this->acm_ != (ACMRandom *)0x0) {
    operator_delete(this->acm_);
  }
  piVar1 = (this->digits_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  pcVar2 = (this->s_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->s_).field_2) {
    operator_delete(pcVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->alphabet_);
  return;
}

Assistant:

StringGenerator::~StringGenerator() {
  delete acm_;
}